

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

void __thiscall Assimp::BaseImporter::~BaseImporter(BaseImporter *this)

{
  this->_vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00759ce0;
  std::__cxx11::string::~string((string *)&this->m_ErrorText);
  std::
  _Rb_tree<Assimp::BaseImporter::ImporterUnits,_std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>,_std::_Select1st<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  ::~_Rb_tree(&(this->importerUnits)._M_t);
  return;
}

Assistant:

BaseImporter::~BaseImporter() {
    // nothing to do here
}